

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpinternalsourcedata.cpp
# Opt level: O3

int __thiscall
jrtplib::RTPInternalSourceData::ProcessSDESItem
          (RTPInternalSourceData *this,uint8_t sdesid,uint8_t *data,size_t itemlen,
          RTPTime *receivetime,bool *cnamecollis)

{
  double dVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  size_t *destlen;
  int iVar5;
  undefined7 in_register_00000031;
  uint8_t **dest;
  SDESItem *this_00;
  
  *cnamecollis = false;
  dVar1 = receivetime->m_t;
  (this->super_RTPSourceData).stats.lastmsgtime.m_t = dVar1;
  iVar5 = 0;
  iVar4 = 0;
  switch((int)CONCAT71(in_register_00000031,sdesid)) {
  case 1:
    sVar2 = (this->super_RTPSourceData).SDESinf.nonprivateitems[0].length;
    if (sVar2 == 0) {
      if (itemlen < 0x100) {
        RTCPSDESInfo::SDESItem::SetString
                  ((this->super_RTPSourceData).SDESinf.nonprivateitems,
                   &(this->super_RTPSourceData).SDESinf.nonprivateitems[0].str,
                   &(this->super_RTPSourceData).SDESinf.nonprivateitems[0].length,data,itemlen);
      }
      (this->super_RTPSourceData).validated = true;
      iVar4 = iVar5;
    }
    else if ((sVar2 != itemlen) ||
            (iVar3 = bcmp(data,(this->super_RTPSourceData).SDESinf.nonprivateitems[0].str,itemlen),
            iVar4 = iVar5, iVar3 != 0)) {
      *cnamecollis = true;
      iVar4 = iVar5;
    }
    break;
  case 2:
    iVar4 = iVar5;
    if (((this->super_RTPSourceData).SDESinf.nonprivateitems[1].length == 0) &&
       (iVar4 = -0x37, itemlen < 0x100)) {
      destlen = &(this->super_RTPSourceData).SDESinf.nonprivateitems[1].length;
      dest = &(this->super_RTPSourceData).SDESinf.nonprivateitems[1].str;
      this_00 = (this->super_RTPSourceData).SDESinf.nonprivateitems + 1;
LAB_0012cd7b:
      iVar4 = RTCPSDESInfo::SDESItem::SetString(this_00,dest,destlen,data,itemlen);
      return iVar4;
    }
    break;
  case 3:
    iVar4 = iVar5;
    if (((this->super_RTPSourceData).SDESinf.nonprivateitems[2].length == 0) &&
       (iVar4 = -0x37, itemlen < 0x100)) {
      destlen = &(this->super_RTPSourceData).SDESinf.nonprivateitems[2].length;
      dest = &(this->super_RTPSourceData).SDESinf.nonprivateitems[2].str;
      this_00 = (this->super_RTPSourceData).SDESinf.nonprivateitems + 2;
      goto LAB_0012cd7b;
    }
    break;
  case 4:
    iVar4 = -0x37;
    if (itemlen < 0x100) {
      this_00 = (this->super_RTPSourceData).SDESinf.nonprivateitems + 3;
      dest = &(this->super_RTPSourceData).SDESinf.nonprivateitems[3].str;
      destlen = &(this->super_RTPSourceData).SDESinf.nonprivateitems[3].length;
      goto LAB_0012cd7b;
    }
    break;
  case 5:
    iVar4 = -0x37;
    if (itemlen < 0x100) {
      this_00 = (this->super_RTPSourceData).SDESinf.nonprivateitems + 4;
      dest = &(this->super_RTPSourceData).SDESinf.nonprivateitems[4].str;
      destlen = &(this->super_RTPSourceData).SDESinf.nonprivateitems[4].length;
      goto LAB_0012cd7b;
    }
    break;
  case 6:
    iVar4 = iVar5;
    if (((this->super_RTPSourceData).SDESinf.nonprivateitems[5].length == 0) &&
       (iVar4 = -0x37, itemlen < 0x100)) {
      destlen = &(this->super_RTPSourceData).SDESinf.nonprivateitems[5].length;
      dest = &(this->super_RTPSourceData).SDESinf.nonprivateitems[5].str;
      this_00 = (this->super_RTPSourceData).SDESinf.nonprivateitems + 5;
      goto LAB_0012cd7b;
    }
    break;
  case 7:
    (this->super_RTPSourceData).stats.lastnotetime.m_t = dVar1;
    iVar4 = -0x37;
    if (itemlen < 0x100) {
      this_00 = (this->super_RTPSourceData).SDESinf.nonprivateitems + 6;
      dest = &(this->super_RTPSourceData).SDESinf.nonprivateitems[6].str;
      destlen = &(this->super_RTPSourceData).SDESinf.nonprivateitems[6].length;
      goto LAB_0012cd7b;
    }
  }
  return iVar4;
}

Assistant:

int RTPInternalSourceData::ProcessSDESItem(uint8_t sdesid,const uint8_t *data,size_t itemlen,const RTPTime &receivetime,bool *cnamecollis)
{
	*cnamecollis = false;
	
	stats.SetLastMessageTime(receivetime);
	
	switch(sdesid)
	{
	case RTCP_SDES_ID_CNAME:
		{
			size_t curlen;
			uint8_t *oldcname;
			
			// NOTE: we're going to make sure that the CNAME is only set once.
			oldcname = SDESinf.GetCNAME(&curlen);
			if (curlen == 0)
			{
				// if CNAME is set, the source is validated
				SDESinf.SetCNAME(data,itemlen);
				validated = true;
			}
			else // check if this CNAME is equal to the one that is already present
			{
				if (curlen != itemlen)
					*cnamecollis = true;
				else
				{
					if (memcmp(data,oldcname,itemlen) != 0)
						*cnamecollis = true;
				}
			}
		}
		break;
	case RTCP_SDES_ID_NAME:
		{
			size_t oldlen;

            		SDESinf.GetName(&oldlen);
			if (oldlen == 0) // Name not set
				return SDESinf.SetName(data,itemlen);
		}
		break;
	case RTCP_SDES_ID_EMAIL:
		{
			size_t oldlen;

			SDESinf.GetEMail(&oldlen);
			if (oldlen == 0)
				return SDESinf.SetEMail(data,itemlen);
		}
		break;
	case RTCP_SDES_ID_PHONE:
		return SDESinf.SetPhone(data,itemlen);
	case RTCP_SDES_ID_LOCATION:
		return SDESinf.SetLocation(data,itemlen);
	case RTCP_SDES_ID_TOOL:
		{
			size_t oldlen;

			SDESinf.GetTool(&oldlen);
			if (oldlen == 0)
				return SDESinf.SetTool(data,itemlen);
		}
		break;
	case RTCP_SDES_ID_NOTE:
		stats.SetLastNoteTime(receivetime);
		return SDESinf.SetNote(data,itemlen);
	}
	return 0;
}